

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  double dVar9;
  long lVar10;
  short sVar11;
  bool bVar12;
  byte bVar13;
  byte bVar14;
  stbi_uc sVar15;
  stbi_uc sVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  stbi__uint32 sVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  stbi__uint32 sVar25;
  stbi__uint32 sVar26;
  int iVar27;
  int iVar28;
  stbi__jpeg *psVar29;
  long lVar30;
  uchar *puVar31;
  stbi_uc *psVar32;
  void *pvVar33;
  code *pcVar34;
  stbi__context *data_00;
  undefined8 *puVar35;
  stbi_uc *psVar36;
  stbi__uint16 *data_01;
  ulong uVar37;
  undefined8 *puVar38;
  undefined1 *puVar39;
  short sVar40;
  byte *pbVar41;
  int id;
  uint uVar42;
  ulong uVar43;
  stbi__context *psVar44;
  int iVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar49;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar50;
  int iVar51;
  ulong uVar52;
  stbi_uc *psVar53;
  uint uVar54;
  int iVar55;
  stbi_uc **ppsVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  short *psVar61;
  stbi__uint16 *psVar62;
  bool bVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar66 [16];
  stbi__uint16 *local_8978;
  stbi_uc *local_8958;
  uint local_8950;
  uint local_88ec;
  stbi_uc *coutput [4];
  int local_88c4;
  int local_88c0;
  int local_88bc;
  short data [64];
  
  psVar36 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar29 = (stbi__jpeg *)malloc(0x4888);
  psVar29->s = s;
  psVar29->idct_block_kernel = stbi__idct_simd;
  psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar20 = stbi__decode_jpeg_header(psVar29,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar29);
  if (iVar20 != 0) {
    psVar29 = (stbi__jpeg *)malloc(0x4888);
    psVar29->s = s;
    psVar29->idct_block_kernel = stbi__idct_simd;
    psVar29->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar29->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar30 = 0x46d8; lVar30 != 0x4858; lVar30 = lVar30 + 0x60) {
        psVar36 = psVar29->huff_dc[0].fast + lVar30 + -8;
        psVar36[0] = '\0';
        psVar36[1] = '\0';
        psVar36[2] = '\0';
        psVar36[3] = '\0';
        psVar36[4] = '\0';
        psVar36[5] = '\0';
        psVar36[6] = '\0';
        psVar36[7] = '\0';
        psVar36[8] = '\0';
        psVar36[9] = '\0';
        psVar36[10] = '\0';
        psVar36[0xb] = '\0';
        psVar36[0xc] = '\0';
        psVar36[0xd] = '\0';
        psVar36[0xe] = '\0';
        psVar36[0xf] = '\0';
      }
      psVar29->restart_interval = 0;
      iVar20 = stbi__decode_jpeg_header(psVar29,0);
      if (iVar20 != 0) {
        paVar1 = psVar29->img_comp;
        bVar13 = stbi__get_marker(psVar29);
LAB_0018b4c4:
        if (bVar13 == 0xda) {
          iVar20 = stbi__get16be(psVar29->s);
          bVar13 = stbi__get8(psVar29->s);
          uVar58 = (uint)bVar13;
          psVar29->scan_n = (uint)bVar13;
          if (((byte)(bVar13 - 5) < 0xfc) ||
             (psVar44 = psVar29->s, psVar44->img_n < (int)(uint)bVar13)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else if (iVar20 == (uint)bVar13 * 2 + 6) {
            lVar30 = 0;
            while( true ) {
              bVar13 = stbi__get8(psVar44);
              if ((int)uVar58 <= lVar30) break;
              bVar14 = stbi__get8(psVar29->s);
              psVar44 = psVar29->s;
              uVar58 = psVar44->img_n;
              uVar37 = 0;
              if (0 < (int)uVar58) {
                uVar37 = (ulong)uVar58;
              }
              paVar49 = paVar1;
              for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
                if (paVar49->id == (uint)bVar13) {
                  uVar37 = uVar52 & 0xffffffff;
                  break;
                }
                paVar49 = paVar49 + 1;
              }
              if ((uint)uVar37 == uVar58) goto LAB_0018cc44;
              psVar29->img_comp[uVar37].hd = (uint)(bVar14 >> 4);
              if (0x3f < bVar14) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0018cc44;
              }
              paVar1[uVar37].ha = bVar14 & 0xf;
              if (3 < (bVar14 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0018cc44;
              }
              psVar29->order[lVar30] = (uint)uVar37;
              lVar30 = lVar30 + 1;
              uVar58 = psVar29->scan_n;
            }
            psVar29->spec_start = (uint)bVar13;
            bVar13 = stbi__get8(psVar29->s);
            psVar29->spec_end = (uint)bVar13;
            bVar13 = stbi__get8(psVar29->s);
            psVar29->succ_high = (uint)(bVar13 >> 4);
            psVar29->succ_low = bVar13 & 0xf;
            iVar20 = psVar29->spec_start;
            if (psVar29->progressive == 0) {
              if (((iVar20 == 0) && (bVar13 < 0x10)) && ((bVar13 & 0xf) == 0)) {
                psVar29->spec_end = 0x3f;
                goto LAB_0018b6c5;
              }
            }
            else if (((iVar20 < 0x40) && (psVar29->spec_end < 0x40)) &&
                    ((iVar20 <= psVar29->spec_end && ((bVar13 < 0xe0 && ((bVar13 & 0xf) < 0xe))))))
            {
LAB_0018b6c5:
              stbi__jpeg_reset(psVar29);
              if (psVar29->progressive == 0) {
                if (psVar29->scan_n == 1) {
                  iVar20 = psVar29->order[0];
                  uVar58 = psVar29->img_comp[iVar20].x + 7 >> 3;
                  iVar28 = psVar29->img_comp[iVar20].y + 7 >> 3;
                  if ((int)uVar58 < 1) {
                    uVar58 = 0;
                  }
                  iVar51 = 0;
                  if (iVar28 < 1) {
                    iVar28 = 0;
                  }
                  for (iVar45 = 0; iVar45 != iVar28; iVar45 = iVar45 + 1) {
                    for (lVar30 = 0; (ulong)uVar58 * 8 != lVar30; lVar30 = lVar30 + 8) {
                      iVar46 = stbi__jpeg_decode_block
                                         (psVar29,data,
                                          (stbi__huffman *)psVar29->huff_dc[paVar1[iVar20].hd].fast,
                                          (stbi__huffman *)psVar29->huff_ac[paVar1[iVar20].ha].fast,
                                          psVar29->fast_ac[paVar1[iVar20].ha],iVar20,
                                          psVar29->dequant[paVar1[iVar20].tq]);
                      if (iVar46 == 0) {
                        bVar63 = false;
                        goto LAB_0018bf50;
                      }
                      (*psVar29->idct_block_kernel)
                                (paVar1[iVar20].data + lVar30 + iVar51 * paVar1[iVar20].w2,
                                 paVar1[iVar20].w2,data);
                      iVar46 = psVar29->todo;
                      psVar29->todo = iVar46 + -1;
                      if (iVar46 < 2) {
                        if (psVar29->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar29);
                        }
                        if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_0018bf4d;
                        stbi__jpeg_reset(psVar29);
                      }
                    }
                    iVar51 = iVar51 + 8;
                  }
                }
                else {
                  for (iVar20 = 0; iVar20 < psVar29->img_mcu_y; iVar20 = iVar20 + 1) {
                    for (iVar28 = 0; iVar28 < psVar29->img_mcu_x; iVar28 = iVar28 + 1) {
                      for (lVar30 = 0; lVar30 < psVar29->scan_n; lVar30 = lVar30 + 1) {
                        iVar51 = psVar29->order[lVar30];
                        for (iVar45 = 0; iVar45 < paVar1[iVar51].v; iVar45 = iVar45 + 1) {
                          for (iVar46 = 0; iVar22 = paVar1[iVar51].h, iVar46 < iVar22;
                              iVar46 = iVar46 + 1) {
                            iVar23 = paVar1[iVar51].v;
                            iVar24 = stbi__jpeg_decode_block
                                               (psVar29,data,
                                                (stbi__huffman *)
                                                psVar29->huff_dc[paVar1[iVar51].hd].fast,
                                                (stbi__huffman *)
                                                psVar29->huff_ac[paVar1[iVar51].ha].fast,
                                                psVar29->fast_ac[paVar1[iVar51].ha],iVar51,
                                                psVar29->dequant[paVar1[iVar51].tq]);
                            if (iVar24 == 0) {
                              bVar63 = false;
                              goto LAB_0018bf50;
                            }
                            (*psVar29->idct_block_kernel)
                                      (paVar1[iVar51].data +
                                       (long)((iVar22 * iVar28 + iVar46) * 8) +
                                       (long)((iVar23 * iVar20 + iVar45) * paVar1[iVar51].w2 * 8),
                                       paVar1[iVar51].w2,data);
                          }
                        }
                      }
                      iVar51 = psVar29->todo;
                      psVar29->todo = iVar51 + -1;
                      if (iVar51 < 2) {
                        if (psVar29->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar29);
                        }
                        if ((psVar29->marker & 0xf8) != 0xd0) goto LAB_0018bf4d;
                        stbi__jpeg_reset(psVar29);
                      }
                    }
                  }
                }
LAB_0018bf4d:
                bVar63 = true;
LAB_0018bf50:
                if (!bVar63) goto LAB_0018cc44;
              }
              else if (psVar29->scan_n == 1) {
                iVar20 = psVar29->order[0];
                iVar28 = psVar29->img_comp[iVar20].x + 7 >> 3;
                iVar51 = psVar29->img_comp[iVar20].y + 7 >> 3;
                iVar45 = 0;
                if (iVar28 < 1) {
                  iVar28 = iVar45;
                }
                if (iVar51 < 1) {
                  iVar51 = iVar45;
                }
                for (; iVar45 != iVar51; iVar45 = iVar45 + 1) {
                  for (iVar46 = 0; iVar46 != iVar28; iVar46 = iVar46 + 1) {
                    psVar61 = paVar1[iVar20].coeff +
                              (paVar1[iVar20].coeff_w * iVar45 + iVar46) * 0x40;
                    uVar37 = (ulong)psVar29->spec_start;
                    if (uVar37 == 0) {
                      iVar22 = stbi__jpeg_decode_block_prog_dc
                                         (psVar29,psVar61,
                                          (stbi__huffman *)psVar29->huff_dc[paVar1[iVar20].hd].fast,
                                          iVar20);
                      if (iVar22 == 0) goto LAB_0018cc44;
                    }
                    else {
                      iVar22 = paVar1[iVar20].ha;
                      psVar36 = psVar29->huff_ac[iVar22].fast;
                      iVar23 = psVar29->eob_run;
                      bVar13 = (byte)psVar29->succ_low;
                      if (psVar29->succ_high == 0) {
                        if (iVar23 == 0) {
                          do {
                            if (psVar29->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar29);
                            }
                            sVar40 = psVar29->fast_ac[iVar22][psVar29->code_buffer >> 0x17];
                            uVar58 = (uint)sVar40;
                            iVar23 = (int)uVar37;
                            if (sVar40 == 0) {
                              uVar58 = stbi__jpeg_huff_decode(psVar29,(stbi__huffman *)psVar36);
                              if ((int)uVar58 < 0) goto LAB_0018c5aa;
                              uVar42 = uVar58 >> 4;
                              if ((uVar58 & 0xf) == 0) {
                                if (uVar58 < 0xf0) {
                                  iVar23 = 1 << ((byte)uVar42 & 0x1f);
                                  psVar29->eob_run = iVar23;
                                  if (0xf < uVar58) {
                                    iVar23 = stbi__jpeg_get_bits(psVar29,uVar42);
                                    iVar23 = iVar23 + psVar29->eob_run;
                                  }
                                  goto LAB_0018b86c;
                                }
                                uVar37 = (ulong)(iVar23 + 0x10);
                              }
                              else {
                                lVar30 = (ulong)uVar42 + (long)iVar23;
                                uVar37 = (ulong)((int)lVar30 + 1);
                                bVar14 = ""[lVar30];
                                iVar23 = stbi__extend_receive(psVar29,uVar58 & 0xf);
                                psVar61[bVar14] = (short)(iVar23 << (bVar13 & 0x1f));
                              }
                            }
                            else {
                              lVar30 = (ulong)(uVar58 >> 4 & 0xf) + (long)iVar23;
                              psVar29->code_buffer = psVar29->code_buffer << (sbyte)(uVar58 & 0xf);
                              psVar29->code_bits = psVar29->code_bits - (uVar58 & 0xf);
                              uVar37 = (ulong)((int)lVar30 + 1);
                              psVar61[""[lVar30]] = (short)((uVar58 >> 8) << (bVar13 & 0x1f));
                            }
                          } while ((int)uVar37 <= psVar29->spec_end);
                        }
                        else {
LAB_0018b86c:
                          psVar29->eob_run = iVar23 + -1;
                        }
                      }
                      else if (iVar23 == 0) {
                        iVar22 = 0x10000 << (bVar13 & 0x1f);
                        do {
                          uVar58 = stbi__jpeg_huff_decode(psVar29,(stbi__huffman *)psVar36);
                          if ((int)uVar58 < 0) goto LAB_0018c5aa;
                          uVar42 = uVar58 >> 4;
                          if ((uVar58 & 0xf) == 1) {
                            iVar23 = stbi__jpeg_get_bit(psVar29);
                            iVar24 = 1;
                            if (iVar23 == 0) {
                              iVar24 = 0xffff;
                            }
                            sVar40 = (short)(iVar24 << (bVar13 & 0x1f));
                          }
                          else {
                            if ((uVar58 & 0xf) != 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              goto LAB_0018cc44;
                            }
                            if (uVar58 < 0xf0) {
                              psVar29->eob_run = ~(-1 << ((byte)uVar42 & 0x1f));
                              if (0xf < uVar58) {
                                iVar23 = stbi__jpeg_get_bits(psVar29,uVar42);
                                psVar29->eob_run = psVar29->eob_run + iVar23;
                              }
                              uVar42 = 0x40;
                            }
                            else {
                              uVar42 = 0xf;
                            }
                            sVar40 = 0;
                          }
                          uVar52 = (long)(int)uVar37;
                          do {
                            while( true ) {
                              uVar37 = uVar52;
                              iVar23 = psVar29->spec_end;
                              if ((long)iVar23 < (long)uVar37) goto LAB_0018b99b;
                              bVar14 = ""[uVar37];
                              if (psVar61[bVar14] == 0) break;
                              iVar23 = stbi__jpeg_get_bit(psVar29);
                              if ((iVar23 != 0) &&
                                 (sVar6 = psVar61[bVar14], (iVar22 >> 0x10 & (int)sVar6) == 0)) {
                                sVar11 = (short)((uint)iVar22 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar11 = -sVar11;
                                }
                                psVar61[bVar14] = sVar6 + sVar11;
                              }
                              uVar52 = uVar37 + 1;
                            }
                            bVar63 = uVar42 != 0;
                            uVar42 = uVar42 - 1;
                            uVar52 = uVar37 + 1;
                          } while (bVar63);
                          psVar61[bVar14] = sVar40;
                          uVar37 = uVar37 + 1;
LAB_0018b99b:
                        } while ((int)uVar37 <= iVar23);
                      }
                      else {
                        psVar29->eob_run = iVar23 + -1;
                        uVar58 = (0x10000 << (bVar13 & 0x1f)) >> 0x10;
                        for (; (long)uVar37 <= (long)psVar29->spec_end; uVar37 = uVar37 + 1) {
                          bVar13 = ""[uVar37];
                          if (((psVar61[bVar13] != 0) &&
                              (iVar22 = stbi__jpeg_get_bit(psVar29), iVar22 != 0)) &&
                             (sVar40 = psVar61[bVar13], (uVar58 & (int)sVar40) == 0)) {
                            uVar42 = -uVar58;
                            if (0 < sVar40) {
                              uVar42 = uVar58;
                            }
                            psVar61[bVar13] = (short)uVar42 + sVar40;
                          }
                        }
                      }
                    }
                    iVar22 = psVar29->todo;
                    psVar29->todo = iVar22 + -1;
                    if (iVar22 < 2) {
                      if (psVar29->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar29);
                      }
                      bVar13 = psVar29->marker;
                      if ((bVar13 & 0xf8) != 0xd0) goto LAB_0018bf5f;
                      stbi__jpeg_reset(psVar29);
                    }
                  }
                }
              }
              else {
                for (iVar20 = 0; iVar20 < psVar29->img_mcu_y; iVar20 = iVar20 + 1) {
                  for (iVar28 = 0; iVar28 < psVar29->img_mcu_x; iVar28 = iVar28 + 1) {
                    for (lVar30 = 0; lVar30 < psVar29->scan_n; lVar30 = lVar30 + 1) {
                      iVar51 = psVar29->order[lVar30];
                      for (iVar45 = 0; iVar45 < paVar1[iVar51].v; iVar45 = iVar45 + 1) {
                        iVar46 = 0;
                        while (iVar46 < paVar1[iVar51].h) {
                          iVar22 = stbi__jpeg_decode_block_prog_dc
                                             (psVar29,paVar1[iVar51].coeff +
                                                      (paVar1[iVar51].h * iVar28 + iVar46 +
                                                      (paVar1[iVar51].v * iVar20 + iVar45) *
                                                      paVar1[iVar51].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar29->huff_dc[paVar1[iVar51].hd].fast,iVar51);
                          iVar46 = iVar46 + 1;
                          if (iVar22 == 0) goto LAB_0018cc44;
                        }
                      }
                    }
                    iVar51 = psVar29->todo;
                    psVar29->todo = iVar51 + -1;
                    if (iVar51 < 2) {
                      if (psVar29->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar29);
                      }
                      bVar13 = psVar29->marker;
                      if ((bVar13 & 0xf8) != 0xd0) goto LAB_0018bf5f;
                      stbi__jpeg_reset(psVar29);
                    }
                  }
                }
              }
              bVar13 = psVar29->marker;
LAB_0018bf5f:
              if (bVar13 == 0xff) {
                do {
                  iVar20 = stbi__at_eof(psVar29->s);
                  if (iVar20 != 0) goto LAB_0018b527;
                  sVar15 = stbi__get8(psVar29->s);
                } while (sVar15 != 0xff);
                sVar15 = stbi__get8(psVar29->s);
                psVar29->marker = sVar15;
              }
              goto LAB_0018b527;
            }
            stbi__g_failure_reason = "bad SOS";
          }
          else {
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_0018cc44;
        }
        if (bVar13 == 0xdc) {
          iVar20 = stbi__get16be(psVar29->s);
          sVar21 = stbi__get16be(psVar29->s);
          if (iVar20 == 4) {
            if (sVar21 == psVar29->s->img_y) goto LAB_0018b527;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_0018cc44;
        }
        if (bVar13 != 0xd9) {
          iVar20 = stbi__process_marker(psVar29,(uint)bVar13);
          if (iVar20 != 0) goto LAB_0018b527;
          goto LAB_0018cc44;
        }
        if (psVar29->progressive == 0) {
          psVar44 = psVar29->s;
          uVar58 = psVar44->img_n;
        }
        else {
          lVar30 = 0;
          while( true ) {
            psVar44 = psVar29->s;
            uVar58 = psVar44->img_n;
            if ((int)uVar58 <= lVar30) break;
            uVar58 = psVar29->img_comp[lVar30].x + 7 >> 3;
            iVar20 = psVar29->img_comp[lVar30].y + 7 >> 3;
            uVar52 = 0;
            uVar37 = (ulong)uVar58;
            if ((int)uVar58 < 1) {
              uVar37 = uVar52;
            }
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            while (iVar28 = (int)uVar52, iVar28 != iVar20) {
              for (uVar52 = 0; uVar52 != uVar37; uVar52 = uVar52 + 1) {
                psVar61 = paVar1[lVar30].coeff;
                iVar45 = paVar1[lVar30].coeff_w * iVar28;
                iVar51 = paVar1[lVar30].tq;
                iVar46 = iVar45 + (int)uVar52;
                for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 1) {
                  psVar61[iVar46 * 0x40 + lVar47] =
                       psVar61[iVar46 * 0x40 + lVar47] * psVar29->dequant[iVar51][lVar47];
                }
                (*psVar29->idct_block_kernel)
                          (paVar1[lVar30].data + uVar52 * 8 + (long)(iVar28 * 8 * paVar1[lVar30].w2)
                           ,paVar1[lVar30].w2,psVar61 + (iVar45 + (int)uVar52) * 0x40);
              }
              uVar52 = (ulong)(iVar28 + 1);
            }
            lVar30 = lVar30 + 1;
          }
        }
        uVar42 = (2 < (int)uVar58) + 1 + (uint)(2 < (int)uVar58);
        if (req_comp != 0) {
          uVar42 = req_comp;
        }
        lVar30 = 0;
        bVar63 = false;
        if ((uVar58 == 3) && (bVar63 = true, psVar29->rgb != 3)) {
          if (psVar29->app14_color_transform == 0) {
            bVar63 = psVar29->jfif == 0;
          }
          else {
            bVar63 = false;
          }
        }
        uVar37 = 0;
        if (0 < (int)uVar58) {
          uVar37 = (ulong)uVar58;
        }
        uVar52 = 1;
        if (bVar63) {
          uVar52 = uVar37;
        }
        if (2 < (int)uVar42) {
          uVar52 = uVar37;
        }
        coutput[2] = (stbi_uc *)0x0;
        coutput[3] = (stbi_uc *)0x0;
        coutput[0] = (stbi_uc *)0x0;
        coutput[1] = (stbi_uc *)0x0;
        if (uVar58 != 3) {
          uVar52 = uVar37;
        }
        do {
          if (uVar52 * 0x30 == lVar30) {
            sVar21 = psVar44->img_y;
            data_00 = (stbi__context *)stbi__malloc_mad3(uVar42,psVar44->img_x,sVar21,1);
            if (data_00 != (stbi__context *)0x0) {
              iVar20 = 0;
              uVar58 = 0;
              do {
                if (sVar21 <= uVar58) {
                  stbi__cleanup_jpeg(psVar29);
                  psVar44 = psVar29->s;
                  *x = psVar44->img_x;
                  *y = psVar44->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar44->img_n) * 2 + 1;
                  }
                  goto LAB_0018cc53;
                }
                sVar21 = psVar44->img_x;
                ppsVar56 = coutput;
                for (lVar30 = 0; uVar52 * 0x30 != lVar30; lVar30 = lVar30 + 0x30) {
                  puVar35 = (undefined8 *)((long)data + lVar30 + 0x10);
                  iVar28 = *(int *)((long)data + lVar30 + 0x24);
                  iVar51 = *(int *)((long)data + lVar30 + 0x1c);
                  iVar45 = iVar51 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar30 + 8);
                  puVar38 = puVar35;
                  if (iVar28 < iVar45) {
                    puVar38 = puVar2;
                  }
                  if (iVar45 <= iVar28) {
                    puVar35 = puVar2;
                  }
                  psVar36 = (stbi_uc *)
                            (**(code **)((long)data + lVar30))
                                      (*(undefined8 *)
                                        ((long)&psVar29->img_comp[0].linebuf + lVar30 * 2),*puVar38,
                                       *puVar35,*(undefined4 *)((long)data + lVar30 + 0x20));
                  *ppsVar56 = psVar36;
                  *(int *)((long)data + lVar30 + 0x24) = iVar28 + 1;
                  if (iVar51 <= iVar28 + 1) {
                    *(undefined4 *)((long)data + lVar30 + 0x24) = 0;
                    lVar47 = *(long *)((long)data + lVar30 + 0x10);
                    *(long *)((long)data + lVar30 + 8) = lVar47;
                    iVar28 = *(int *)((long)data + lVar30 + 0x28) + 1;
                    *(int *)((long)data + lVar30 + 0x28) = iVar28;
                    if (iVar28 < *(int *)((long)&psVar29->img_comp[0].y + lVar30 * 2)) {
                      *(long *)((long)data + lVar30 + 0x10) =
                           lVar47 + *(int *)((long)&psVar29->img_comp[0].w2 + lVar30 * 2);
                    }
                  }
                  ppsVar56 = ppsVar56 + 1;
                }
                if ((int)uVar42 < 3) {
                  psVar44 = psVar29->s;
                  if (bVar63) {
                    uVar37 = (ulong)(sVar21 * iVar20);
                    if (uVar42 == 1) {
                      for (uVar48 = 0; uVar48 < psVar44->img_x; uVar48 = uVar48 + 1) {
                        data_00->buffer_start[uVar48 + uVar37 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar48] * 0x1d +
                                       (uint)coutput[1][uVar48] * 0x96 +
                                       (uint)coutput[0][uVar48] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar48 = 0; uVar48 < psVar44->img_x; uVar48 = uVar48 + 1) {
                        data_00->buffer_start[uVar48 * 2 + uVar37 + -0x38] =
                             (stbi_uc)((uint)coutput[2][uVar48] * 0x1d +
                                       (uint)coutput[1][uVar48] * 0x96 +
                                       (uint)coutput[0][uVar48] * 0x4d >> 8);
                        data_00->buffer_start[uVar48 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar44->img_n == 4) {
                    if (psVar29->app14_color_transform == 2) {
                      psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                        iVar28 = (coutput[0][uVar37] ^ 0xff) * (uint)coutput[3][uVar37];
                        psVar36[-1] = (char)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                    else {
                      if (psVar29->app14_color_transform != 0) goto LAB_0018d7ed;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x37);
                      for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                        bVar13 = coutput[3][uVar37];
                        iVar28 = (uint)coutput[0][uVar37] * (uint)bVar13;
                        iVar51 = (uint)coutput[1][uVar37] * (uint)bVar13;
                        psVar36[-1] = (char)((((uint)coutput[2][uVar37] * (uint)bVar13 + 0x80 >> 8)
                                              + (uint)coutput[2][uVar37] * (uint)bVar13 + 0x80 >> 8)
                                             * 0x1d + (iVar51 + (iVar51 + 0x80U >> 8) + 0x80 >> 8) *
                                                      0x96 + (iVar28 + (iVar28 + 0x80U >> 8) + 0x80
                                                             >> 8) * 0x4d >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                  }
                  else {
LAB_0018d7ed:
                    uVar37 = (ulong)(sVar21 * iVar20);
                    if (uVar42 == 1) {
                      for (uVar48 = 0; uVar48 < psVar44->img_x; uVar48 = uVar48 + 1) {
                        data_00->buffer_start[uVar48 + uVar37 + -0x38] = coutput[0][uVar48];
                      }
                    }
                    else {
                      for (uVar48 = 0; uVar48 < psVar44->img_x; uVar48 = uVar48 + 1) {
                        data_00->buffer_start[uVar48 * 2 + uVar37 + -0x38] = coutput[0][uVar48];
                        data_00->buffer_start[uVar48 * 2 + uVar37 + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar44 = psVar29->s;
                  if (psVar44->img_n == 3) {
                    if (bVar63) {
                      psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                        psVar36[-3] = coutput[0][uVar37];
                        psVar36[-2] = coutput[1][uVar37];
                        psVar36[-1] = coutput[2][uVar37];
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                    else {
LAB_0018d823:
                      (*psVar29->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar58 * uVar42 * sVar21) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar44->img_x,uVar42);
                    }
                  }
                  else if (psVar44->img_n == 4) {
                    if (psVar29->app14_color_transform == 2) {
                      (*psVar29->YCbCr_to_RGB_kernel)
                                (data_00->buffer_start + ((ulong)(uVar58 * uVar42 * sVar21) - 0x38),
                                 coutput[0],coutput[1],coutput[2],psVar44->img_x,uVar42);
                      psVar44 = psVar29->s;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x36);
                      for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                        bVar13 = coutput[3][uVar37];
                        iVar28 = (psVar36[-2] ^ 0xff) * (uint)bVar13;
                        psVar36[-2] = (byte)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        iVar28 = (psVar36[-1] ^ 0xff) * (uint)bVar13;
                        psVar36[-1] = (byte)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        iVar28 = (*psVar36 ^ 0xff) * (uint)bVar13;
                        *psVar36 = (byte)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                    else {
                      if (psVar29->app14_color_transform != 0) goto LAB_0018d823;
                      psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                      for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                        bVar13 = coutput[3][uVar37];
                        iVar28 = (uint)coutput[0][uVar37] * (uint)bVar13;
                        psVar36[-3] = (char)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        iVar28 = (uint)coutput[1][uVar37] * (uint)bVar13;
                        psVar36[-2] = (char)((iVar28 + 0x80U >> 8) + iVar28 + 0x80 >> 8);
                        psVar36[-1] = (char)(((uint)coutput[2][uVar37] * (uint)bVar13 + 0x80 >> 8) +
                                             (uint)coutput[2][uVar37] * (uint)bVar13 + 0x80 >> 8);
                        *psVar36 = 0xff;
                        psVar36 = psVar36 + uVar42;
                      }
                    }
                  }
                  else {
                    psVar36 = data_00->buffer_start + ((ulong)(sVar21 * iVar20) - 0x35);
                    for (uVar37 = 0; uVar37 < psVar44->img_x; uVar37 = uVar37 + 1) {
                      sVar15 = coutput[0][uVar37];
                      psVar36[-1] = sVar15;
                      psVar36[-2] = sVar15;
                      psVar36[-3] = sVar15;
                      *psVar36 = 0xff;
                      psVar36 = psVar36 + uVar42;
                    }
                  }
                }
                uVar58 = uVar58 + 1;
                psVar44 = psVar29->s;
                sVar21 = psVar44->img_y;
                iVar20 = iVar20 + uVar42;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar29);
LAB_0018d9ce:
            stbi__g_failure_reason = "outofmem";
            goto LAB_0018cc51;
          }
          sVar21 = psVar44->img_x;
          pvVar33 = malloc((ulong)(sVar21 + 3));
          *(void **)((long)&psVar29->img_comp[0].linebuf + lVar30 * 2) = pvVar33;
          if (pvVar33 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar29);
            goto LAB_0018d9ce;
          }
          uVar37 = (long)psVar29->img_h_max /
                   (long)*(int *)((long)&psVar29->img_comp[0].h + lVar30 * 2);
          iVar20 = (int)uVar37;
          *(int *)((long)data + lVar30 + 0x18) = iVar20;
          iVar28 = psVar29->img_v_max / *(int *)((long)&psVar29->img_comp[0].v + lVar30 * 2);
          *(int *)((long)data + lVar30 + 0x1c) = iVar28;
          *(int *)((long)data + lVar30 + 0x24) = iVar28 >> 1;
          *(int *)((long)data + lVar30 + 0x20) =
               (int)((ulong)((sVar21 + iVar20) - 1) / (uVar37 & 0xffffffff));
          *(undefined4 *)((long)data + lVar30 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar29->img_comp[0].data + lVar30 * 2);
          *(undefined8 *)((long)data + lVar30 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar30 + 8) = uVar8;
          if (iVar20 == 2) {
            pcVar34 = stbi__resample_row_h_2;
            if (iVar28 != 1) {
              if (iVar28 != 2) goto LAB_0018d367;
              pcVar34 = psVar29->resample_row_hv_2_kernel;
            }
          }
          else if (iVar20 == 1) {
            pcVar34 = stbi__resample_row_generic;
            if (iVar28 == 2) {
              pcVar34 = stbi__resample_row_v_2;
            }
            if (iVar28 == 1) {
              pcVar34 = resample_row_1;
            }
          }
          else {
LAB_0018d367:
            pcVar34 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar30) = pcVar34;
          lVar30 = lVar30 + 0x30;
        } while( true );
      }
LAB_0018cc44:
      stbi__cleanup_jpeg(psVar29);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0018cc51:
    data_00 = (stbi__context *)0x0;
    goto LAB_0018cc53;
  }
  iVar20 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar20 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    data._0_8_ = s;
    iVar20 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
    uVar8 = data._0_8_;
    if (iVar20 == 0) {
      data_00 = (stbi__context *)0x0;
    }
    else {
      iVar20 = 8;
      if (8 < (int)data._32_4_) {
        iVar20 = data._32_4_;
      }
      ri->bits_per_channel = iVar20;
      if ((req_comp != 0) && (iVar20 = *(int *)(data._0_8_ + 0xc), iVar20 != req_comp)) {
        if ((int)data._32_4_ < 9) {
          data._24_8_ = stbi__convert_format
                                  ((uchar *)data._24_8_,iVar20,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        else {
          data._24_8_ = stbi__convert_format16
                                  ((stbi__uint16 *)data._24_8_,iVar20,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        *(int *)(uVar8 + 0xc) = req_comp;
        if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar8;
      *y = *(int *)(uVar8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar8 + 8);
      }
      data_00 = (stbi__context *)data._24_8_;
      data._24_8_ = (void *)0x0;
    }
    free((void *)data._24_8_);
    free((void *)data._16_8_);
    psVar29 = (stbi__jpeg *)data._8_8_;
    goto LAB_0018cc53;
  }
  sVar15 = stbi__get8(s);
  if ((sVar15 == 'B') && (sVar15 = stbi__get8(s), sVar15 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar21 = stbi__get32le(s);
    if (((sVar21 < 0x39) && ((0x100010000001000U >> ((ulong)sVar21 & 0x3f) & 1) != 0)) ||
       ((sVar21 == 0x7c || (sVar21 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3] = (stbi_uc *)CONCAT44(0xff,(uint)coutput[3]);
      pvVar33 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar33 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar21 = s->img_y;
      sVar25 = -sVar21;
      if (0 < (int)sVar21) {
        sVar25 = sVar21;
      }
      s->img_y = sVar25;
      uVar58 = (uint)coutput[3];
      local_8950 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          uVar42 = (int)(coutput[0]._4_4_ + -0x26) / 3;
          goto LAB_0018c3d6;
        }
LAB_0018c3af:
        uVar57 = 0;
        uVar42 = 0;
        if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_0018c3d6;
        iVar28 = 3;
        iVar20 = 0x18;
        bVar63 = true;
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_0018c3af;
        uVar42 = (int)((coutput[0]._4_4_ - (int)coutput[1]) + -0xe) >> 2;
LAB_0018c3d6:
        uVar57 = uVar42;
        bVar63 = (uint)coutput[3] == 0xff000000;
        iVar28 = 4 - (uint)((uint)coutput[3] == 0);
        iVar20 = (int)coutput[0];
      }
      s->img_n = iVar28;
      if (2 < req_comp) {
        iVar28 = req_comp;
      }
      sVar26 = s->img_x;
      iVar51 = stbi__mad3sizes_valid(iVar28,sVar26,sVar25,0);
      if (iVar51 == 0) goto LAB_0018e2c6;
      puVar31 = (uchar *)stbi__malloc_mad3(iVar28,sVar26,sVar25,0);
      if (puVar31 == (uchar *)0x0) goto LAB_0018ceba;
      if (iVar20 < 0x10) {
        if (0x100 < (int)uVar57 || uVar57 == 0) {
          free(puVar31);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar52 = 0;
        uVar37 = 0;
        if (0 < (int)uVar57) {
          uVar37 = (ulong)uVar57;
        }
        for (; uVar37 != uVar52; uVar52 = uVar52 + 1) {
          sVar15 = stbi__get8(s);
          *(stbi_uc *)(data + uVar52 * 2 + 1) = sVar15;
          sVar15 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar52 * 4 + 1) = sVar15;
          sVar15 = stbi__get8(s);
          *(stbi_uc *)(data + uVar52 * 2) = sVar15;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar52 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(uVar57 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if (iVar20 == 1) {
          sVar26 = s->img_x;
          iVar20 = 0;
          uVar37 = 0;
LAB_0018db32:
          sVar25 = s->img_y;
          if (iVar20 < (int)sVar25) {
            iVar51 = 0;
            do {
              bVar13 = stbi__get8(s);
              sVar25 = s->img_x;
              iVar45 = 8;
              do {
                if ((int)sVar25 <= iVar51) {
LAB_0018dbcf:
                  uVar37 = uVar37 & 0xffffffff;
                  stbi__skip(s,-(sVar26 + 7 >> 3) & 3);
                  iVar20 = iVar20 + 1;
                  goto LAB_0018db32;
                }
                uVar52 = (ulong)((bVar13 >> (iVar45 - 1U & 0x1f) & 1) != 0);
                iVar46 = (int)uVar37;
                lVar30 = (long)iVar46;
                uVar37 = lVar30 + 3;
                puVar31[lVar30] = (uchar)data[uVar52 * 2];
                puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
                puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
                if (iVar28 == 4) {
                  puVar31[lVar30 + 3] = 0xff;
                  uVar37 = (ulong)(iVar46 + 4);
                }
                if (sVar25 - 1 == iVar51) goto LAB_0018dbcf;
                iVar51 = iVar51 + 1;
                iVar46 = iVar45 + -1;
                bVar63 = 0 < iVar45;
                iVar45 = iVar46;
              } while (iVar46 != 0 && bVar63);
            } while( true );
          }
        }
        else {
          if (iVar20 == 8) {
            uVar58 = s->img_x;
          }
          else {
            if (iVar20 != 4) {
              free(puVar31);
              stbi__g_failure_reason = "bad bpp";
              return (void *)0x0;
            }
            uVar58 = s->img_x + 1 >> 1;
          }
          uVar37 = 0;
          for (iVar51 = 0; sVar25 = s->img_y, iVar51 < (int)sVar25; iVar51 = iVar51 + 1) {
            for (iVar45 = 0; iVar45 < (int)s->img_x; iVar45 = iVar45 + 2) {
              bVar13 = stbi__get8(s);
              uVar42 = (uint)(bVar13 >> 4);
              if (iVar20 != 4) {
                uVar42 = (uint)bVar13;
              }
              uVar52 = (ulong)uVar42;
              uVar42 = bVar13 & 0xf;
              if (iVar20 != 4) {
                uVar42 = 0;
              }
              lVar30 = (long)(int)uVar37;
              uVar48 = lVar30 + 3;
              puVar31[lVar30] = (uchar)data[uVar52 * 2];
              puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
              puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
              if (iVar28 == 4) {
                puVar31[lVar30 + 3] = 0xff;
                uVar48 = (ulong)((int)uVar37 + 4);
              }
              if (iVar45 + 1U == s->img_x) {
                uVar37 = uVar48 & 0xffffffff;
                break;
              }
              if (iVar20 == 8) {
                bVar13 = stbi__get8(s);
                uVar42 = (uint)bVar13;
              }
              lVar30 = (long)(int)uVar48;
              uVar37 = lVar30 + 3;
              uVar52 = (ulong)uVar42;
              puVar31[lVar30] = (uchar)data[uVar52 * 2];
              puVar31[lVar30 + 1] = *(uchar *)((long)data + uVar52 * 4 + 1);
              puVar31[lVar30 + 2] = (uchar)data[uVar52 * 2 + 1];
              if (iVar28 == 4) {
                puVar31[lVar30 + 3] = 0xff;
                uVar37 = (ulong)((int)uVar48 + 4);
              }
            }
            stbi__skip(s,-uVar58 & 3);
          }
        }
        goto LAB_0018dbea;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if (iVar20 == 0x10) {
        local_88ec = s->img_x * 2 & 2;
LAB_0018cf6e:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar31);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar51 = stbi__high_bit(coutput[1]._4_4_);
        iVar51 = iVar51 + -7;
        iVar45 = stbi__bitcount(coutput[1]._4_4_);
        iVar46 = stbi__high_bit((uint)coutput[2]);
        iVar46 = iVar46 + -7;
        iVar22 = stbi__bitcount((uint)coutput[2]);
        iVar23 = stbi__high_bit(coutput[2]._4_4_);
        iVar23 = iVar23 + -7;
        local_88bc = stbi__bitcount(coutput[2]._4_4_);
        local_88c0 = stbi__high_bit(uVar58);
        local_88c0 = local_88c0 + -7;
        local_88c4 = stbi__bitcount(uVar58);
        bVar12 = true;
        bVar63 = false;
      }
      else {
        if (iVar20 == 0x20) {
          local_88ec = 0;
          if (!(bool)((coutput[1]._4_4_ == 0xff0000 &&
                      ((uint)coutput[2] == 0xff00 && coutput[2]._4_4_ == 0xff)) & bVar63))
          goto LAB_0018cf6e;
          bVar63 = true;
        }
        else {
          local_88ec = 0;
          if (iVar20 != 0x18) goto LAB_0018cf6e;
          local_88ec = s->img_x & 3;
          bVar63 = false;
        }
        bVar12 = false;
        iVar51 = 0;
        iVar46 = 0;
        iVar23 = 0;
        local_88c0 = 0;
        iVar45 = 0;
        iVar22 = 0;
        local_88bc = 0;
        local_88c4 = 0;
      }
      uVar37 = 0;
      for (iVar24 = 0; sVar25 = s->img_y, iVar24 < (int)sVar25; iVar24 = iVar24 + 1) {
        if (bVar12) {
          for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
            if (iVar20 == 0x10) {
              uVar42 = stbi__get16le(s);
            }
            else {
              uVar42 = stbi__get32le(s);
            }
            iVar27 = stbi__shiftsigned(uVar42 & coutput[1]._4_4_,iVar51,iVar45);
            lVar30 = (long)(int)uVar37;
            puVar31[lVar30] = (uchar)iVar27;
            iVar27 = stbi__shiftsigned(uVar42 & (uint)coutput[2],iVar46,iVar22);
            puVar31[lVar30 + 1] = (uchar)iVar27;
            iVar27 = stbi__shiftsigned(uVar42 & coutput[2]._4_4_,iVar23,local_88bc);
            puVar31[lVar30 + 2] = (uchar)iVar27;
            if (uVar58 == 0) {
              uVar42 = 0xff;
            }
            else {
              uVar42 = stbi__shiftsigned(uVar42 & uVar58,local_88c0,local_88c4);
            }
            uVar52 = lVar30 + 3;
            if (iVar28 == 4) {
              puVar31[lVar30 + 3] = (uchar)uVar42;
              uVar52 = (ulong)((int)uVar37 + 4);
            }
            local_8950 = local_8950 | uVar42;
            uVar37 = uVar52 & 0xffffffff;
          }
        }
        else {
          for (iVar55 = 0; iVar55 < (int)s->img_x; iVar55 = iVar55 + 1) {
            sVar15 = stbi__get8(s);
            lVar30 = (long)(int)uVar37;
            puVar31[lVar30 + 2] = sVar15;
            sVar15 = stbi__get8(s);
            puVar31[lVar30 + 1] = sVar15;
            sVar15 = stbi__get8(s);
            puVar31[lVar30] = sVar15;
            bVar13 = 0xff;
            if (bVar63) {
              bVar13 = stbi__get8(s);
            }
            uVar52 = lVar30 + 3;
            if (iVar28 == 4) {
              puVar31[lVar30 + 3] = bVar13;
              uVar52 = (ulong)((int)uVar37 + 4);
            }
            local_8950 = local_8950 | bVar13;
            uVar37 = uVar52 & 0xffffffff;
          }
        }
        stbi__skip(s,local_88ec);
      }
LAB_0018dbea:
      if ((iVar28 == 4) && (local_8950 == 0)) {
        for (uVar58 = s->img_x * sVar25 * 4 - 1; -1 < (int)uVar58; uVar58 = uVar58 - 4) {
          puVar31[uVar58] = 0xff;
        }
      }
      if (0 < (int)sVar21) {
        iVar20 = (int)sVar25 >> 1;
        if ((int)sVar25 >> 1 < 1) {
          iVar20 = 0;
        }
        iVar51 = (sVar25 - 1) * iVar28;
        iVar46 = 0;
        for (iVar45 = 0; iVar45 != iVar20; iVar45 = iVar45 + 1) {
          sVar21 = s->img_x;
          uVar37 = (ulong)(sVar21 * iVar28);
          if ((int)(sVar21 * iVar28) < 1) {
            uVar37 = 0;
          }
          for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
            uVar4 = puVar31[uVar52 + sVar21 * iVar46];
            puVar31[uVar52 + sVar21 * iVar46] = puVar31[uVar52 + sVar21 * iVar51];
            puVar31[uVar52 + sVar21 * iVar51] = uVar4;
          }
          iVar51 = iVar51 - iVar28;
          iVar46 = iVar46 + iVar28;
        }
      }
      uVar58 = s->img_x;
      if ((req_comp != 0) && (iVar28 != req_comp)) {
        puVar31 = stbi__convert_format(puVar31,iVar28,req_comp,uVar58,sVar25);
        if (puVar31 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar58 = s->img_x;
      }
      *x = uVar58;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar31;
      }
      return puVar31;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar20 = stbi__gif_test(s);
  if (iVar20 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar36);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar29 = (stbi__jpeg *)data._16_8_;
    goto LAB_0018cc53;
  }
  sVar21 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar21 == 0x38425053) {
    sVar21 = stbi__get32be(s);
    if (sVar21 != 0x38425053) {
      stbi__g_failure_reason = "not PSD";
      return (void *)0x0;
    }
    iVar20 = stbi__get16be(s);
    if (iVar20 != 1) {
      stbi__g_failure_reason = "wrong version";
      return (void *)0x0;
    }
    stbi__skip(s,6);
    uVar58 = stbi__get16be(s);
    if (0x10 < uVar58) {
      stbi__g_failure_reason = "wrong channel count";
      return (void *)0x0;
    }
    sVar21 = stbi__get32be(s);
    sVar25 = stbi__get32be(s);
    uVar42 = stbi__get16be(s);
    if (((short)uVar42 != 8) && ((uVar42 & 0xffff) != 0x10)) {
      stbi__g_failure_reason = "unsupported bit depth";
      return (void *)0x0;
    }
    iVar20 = stbi__get16be(s);
    if (iVar20 != 3) {
      stbi__g_failure_reason = "wrong color format";
      return (void *)0x0;
    }
    sVar26 = stbi__get32be(s);
    stbi__skip(s,sVar26);
    sVar26 = stbi__get32be(s);
    stbi__skip(s,sVar26);
    sVar26 = stbi__get32be(s);
    stbi__skip(s,sVar26);
    uVar57 = stbi__get16be(s);
    if (1 < uVar57) {
      stbi__g_failure_reason = "bad compression";
      return (void *)0x0;
    }
    iVar20 = stbi__mad3sizes_valid(4,sVar25,sVar21,0);
    if (iVar20 == 0) goto LAB_0018e2c6;
    if (((bpc == 0x10) && (uVar42 == 0x10)) && (uVar57 == 0)) {
      data_01 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar25,sVar21,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_01 = (stbi__uint16 *)malloc((long)(int)(sVar21 * sVar25 * 4));
    }
    if (data_01 != (stbi__uint16 *)0x0) {
      uVar60 = sVar25 * sVar21;
      if (uVar57 == 0) {
        uVar37 = 0;
        psVar62 = data_01;
        local_8978 = data_01;
        uVar57 = 0;
        if (0 < (int)uVar60) {
          uVar57 = uVar60;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar58) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar30 = 0; uVar57 != (uint)lVar30; lVar30 = lVar30 + 1) {
                iVar20 = stbi__get16be(s);
                local_8978[lVar30 * 4] = (stbi__uint16)iVar20;
              }
            }
            else {
              lVar30 = 0;
              if (uVar42 == 0x10) {
                for (; uVar57 != (uint)lVar30; lVar30 = lVar30 + 1) {
                  iVar20 = stbi__get16be(s);
                  *(char *)(psVar62 + lVar30 * 2) = (char)((uint)iVar20 >> 8);
                }
              }
              else {
                for (; uVar57 != (uint)lVar30; lVar30 = lVar30 + 1) {
                  sVar15 = stbi__get8(s);
                  *(stbi_uc *)(psVar62 + lVar30 * 2) = sVar15;
                }
              }
            }
          }
          else if (uVar42 == 0x10 && bpc == 0x10) {
            for (lVar30 = 0; uVar57 != (uint)lVar30; lVar30 = lVar30 + 1) {
              local_8978[lVar30 * 4] = -(ushort)(uVar37 == 3);
            }
          }
          else {
            for (lVar30 = 0; uVar57 != (uint)lVar30; lVar30 = lVar30 + 1) {
              *(char *)(psVar62 + lVar30 * 2) = -(uVar37 == 3);
            }
          }
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
          local_8978 = local_8978 + 1;
        }
      }
      else {
        stbi__skip(s,sVar21 * uVar58 * 2);
        uVar37 = 0;
        psVar62 = data_01;
        uVar42 = 0;
        if (0 < (int)uVar60) {
          uVar42 = uVar60;
        }
        for (; uVar37 != 4; uVar37 = uVar37 + 1) {
          if (uVar37 < uVar58) {
            psVar36 = (stbi_uc *)((long)data_01 + uVar37);
            iVar20 = 0;
            do {
              uVar57 = uVar60 - iVar20;
              do {
                if ((int)uVar57 < 1) goto LAB_0018de88;
                bVar13 = stbi__get8(s);
              } while (bVar13 == 0x80);
              uVar59 = (uint)bVar13;
              if ((char)bVar13 < '\0') {
                uVar54 = 0x101 - uVar59;
                if (uVar57 < uVar54) goto LAB_0018e3f7;
                sVar15 = stbi__get8(s);
                for (iVar28 = uVar59 - 0x101; iVar28 != 0; iVar28 = iVar28 + 1) {
                  *psVar36 = sVar15;
                  psVar36 = psVar36 + 4;
                }
              }
              else {
                if (uVar57 <= bVar13) {
LAB_0018e3f7:
                  free(data_01);
                  stbi__g_failure_reason = "corrupt";
                  return (void *)0x0;
                }
                uVar54 = uVar59 + 1;
                uVar57 = uVar54;
                while (bVar63 = uVar57 != 0, uVar57 = uVar57 - 1, bVar63) {
                  sVar15 = stbi__get8(s);
                  *psVar36 = sVar15;
                  psVar36 = psVar36 + 4;
                }
              }
              iVar20 = iVar20 + uVar54;
            } while( true );
          }
          for (lVar30 = 0; uVar42 != (uint)lVar30; lVar30 = lVar30 + 1) {
            *(char *)(psVar62 + lVar30 * 2) = -(uVar37 == 3);
          }
LAB_0018de88:
          psVar62 = (stbi__uint16 *)((long)psVar62 + 1);
        }
      }
      if (3 < uVar58) {
        uVar37 = 0;
        if (0 < (int)uVar60) {
          uVar37 = (ulong)uVar60;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
            uVar7 = data_01[uVar52 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar65 = 1.0 / ((float)uVar7 / 65535.0);
              fVar64 = (1.0 - fVar65) * 65535.0;
              auVar66._0_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) & 0xffff));
              auVar66._4_4_ =
                   (int)(fVar64 + fVar65 * (float)(*(uint *)(data_01 + uVar52 * 4) >> 0x10));
              auVar66._8_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66._12_4_ = (int)(fVar64 + fVar65 * 0.0);
              auVar66 = pshuflw(auVar66,auVar66,0xe8);
              *(int *)(data_01 + uVar52 * 4) = auVar66._0_4_;
              data_01[uVar52 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_01[uVar52 * 4 + 2] * fVar65 + fVar64);
            }
          }
        }
        else {
          for (uVar52 = 0; uVar37 != uVar52; uVar52 = uVar52 + 1) {
            bVar13 = *(byte *)((long)data_01 + uVar52 * 4 + 3);
            if ((bVar13 != 0) && (bVar13 != 0xff)) {
              fVar65 = 1.0 / ((float)bVar13 / 255.0);
              fVar64 = (1.0 - fVar65) * 255.0;
              *(char *)(data_01 + uVar52 * 2) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2] * fVar65 + fVar64);
              *(char *)((long)data_01 + uVar52 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_01 + uVar52 * 4 + 1) * fVar65 + fVar64);
              *(char *)(data_01 + uVar52 * 2 + 1) =
                   (char)(int)((float)(byte)data_01[uVar52 * 2 + 1] * fVar65 + fVar64);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_01 = stbi__convert_format16(data_01,4,req_comp,sVar25,sVar21);
        }
        else {
          data_01 = (stbi__uint16 *)stbi__convert_format((uchar *)data_01,4,req_comp,sVar25,sVar21);
        }
        if (data_01 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar21;
      *x = sVar25;
      return data_01;
    }
    goto LAB_0018ceba;
  }
  iVar20 = stbi__pic_is4(s,anon_var_dwarf_d2366);
  if (iVar20 == 0) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    iVar20 = 0x54;
    while (bVar63 = iVar20 != 0, iVar20 = iVar20 + -1, bVar63) {
      stbi__get8(s);
    }
    iVar20 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar20 != 0) {
      iVar20 = 0x5c;
      while (bVar63 = iVar20 != 0, iVar20 = iVar20 + -1, bVar63) {
        stbi__get8(s);
      }
      uVar58 = stbi__get16be(s);
      uVar42 = stbi__get16be(s);
      iVar20 = stbi__at_eof(s);
      if (iVar20 != 0) {
        stbi__g_failure_reason = "bad file";
        return (void *)0x0;
      }
      bVar13 = 0;
      iVar20 = stbi__mad3sizes_valid(uVar58,uVar42,4,0);
      if (iVar20 == 0) goto LAB_0018e2c6;
      stbi__get32be(s);
      stbi__get16be(s);
      stbi__get16be(s);
      psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar58,uVar42,4,0);
      memset(psVar29,0xff,(ulong)(uVar58 * 4 * uVar42));
      pbVar41 = (byte *)(data + 1);
      lVar30 = 0;
      psVar44 = (stbi__context *)(ulong)uVar42;
      do {
        if (lVar30 == 10) {
LAB_0018cea6:
          s = psVar44;
          stbi__g_failure_reason = "bad format";
LAB_0018d9e1:
          iVar20 = (int)s;
          goto LAB_0018df8f;
        }
        sVar15 = stbi__get8(s);
        bVar14 = stbi__get8(s);
        pbVar41[-2] = bVar14;
        bVar17 = stbi__get8(s);
        pbVar41[-1] = bVar17;
        bVar17 = stbi__get8(s);
        *pbVar41 = bVar17;
        iVar20 = stbi__at_eof(s);
        if (iVar20 != 0) {
          stbi__g_failure_reason = "bad file";
          goto LAB_0018d9e1;
        }
        psVar44 = s;
        if (bVar14 != 8) goto LAB_0018cea6;
        bVar13 = bVar13 | bVar17;
        pbVar41 = pbVar41 + 3;
        lVar30 = lVar30 + 1;
      } while (sVar15 != '\0');
      iVar20 = 4 - (uint)((bVar13 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = iVar20;
      }
      for (uVar37 = 0; uVar37 != uVar42; uVar37 = uVar37 + 1) {
        psVar36 = psVar29->huff_dc[0].fast + (long)(int)(uVar58 * 4 * (int)uVar37) + -8;
        for (lVar47 = 0; lVar30 != lVar47; lVar47 = lVar47 + 1) {
          lVar10 = lVar47 * 3;
          cVar3 = *(char *)((long)data + lVar10 + 1);
          psVar53 = psVar36;
          uVar57 = uVar58;
          if (cVar3 == '\0') {
            while (bVar63 = uVar57 != 0, uVar57 = uVar57 - 1, bVar63) {
              psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),psVar53);
              if (psVar32 == (stbi_uc *)0x0) goto LAB_0018df8f;
              psVar53 = psVar53 + 4;
            }
          }
          else if (cVar3 == '\x01') {
            for (; 0 < (int)uVar57; uVar57 = uVar57 - (uVar60 & 0xff)) {
              bVar13 = stbi__get8(s);
              iVar28 = stbi__at_eof(s);
              if (iVar28 != 0) goto LAB_0018df6e;
              psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),(stbi_uc *)coutput)
              ;
              if (psVar32 == (stbi_uc *)0x0) goto LAB_0018df8f;
              uVar60 = (uint)bVar13;
              if (uVar57 < bVar13) {
                uVar60 = uVar57;
              }
              uVar59 = uVar60 & 0xff;
              while (bVar63 = uVar59 != 0, uVar59 = uVar59 - 1, bVar63) {
                stbi__copyval((uint)*(byte *)((long)data + lVar10 + 2),psVar53,(stbi_uc *)coutput);
                psVar53 = psVar53 + 4;
              }
            }
          }
          else {
            if (cVar3 != '\x02') {
              stbi__g_failure_reason = "bad format";
              goto LAB_0018df8f;
            }
            for (; 0 < (int)uVar57; uVar57 = uVar57 - iVar28) {
              bVar13 = stbi__get8(s);
              iVar28 = stbi__at_eof(s);
              if (iVar28 != 0) goto LAB_0018df6e;
              uVar60 = (uint)bVar13;
              if ((char)bVar13 < '\0') {
                if (uVar60 == 0x80) {
                  iVar28 = stbi__get16be(s);
                }
                else {
                  iVar28 = uVar60 - 0x7f;
                }
                if ((int)uVar57 < iVar28) goto LAB_0018df6e;
                psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),
                                        (stbi_uc *)coutput);
                iVar51 = iVar28;
                if (psVar32 == (stbi_uc *)0x0) goto LAB_0018df8f;
                while (iVar51 != 0) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar10 + 2),psVar53,(stbi_uc *)coutput)
                  ;
                  psVar53 = psVar53 + 4;
                  iVar51 = iVar51 + -1;
                }
              }
              else {
                iVar28 = bVar13 + 1;
                iVar51 = iVar28;
                if (uVar57 <= uVar60) goto LAB_0018df6e;
                while (bVar63 = iVar51 != 0, iVar51 = iVar51 + -1, bVar63) {
                  psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar10 + 2),psVar53);
                  if (psVar32 == (stbi_uc *)0x0) goto LAB_0018df8f;
                  psVar53 = psVar53 + 4;
                }
              }
            }
          }
        }
      }
      if (psVar29 == (stbi__jpeg *)0x0) goto LAB_0018df8f;
      goto LAB_0018df96;
    }
  }
  sVar15 = stbi__get8(s);
  sVar16 = stbi__get8(s);
  if ((sVar15 == 'P') && (0xfd < (byte)(sVar16 - 0x37))) {
    iVar20 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
    if (iVar20 == 0) {
      return (void *)0x0;
    }
    *x = s->img_x;
    sVar21 = s->img_y;
    *y = sVar21;
    iVar20 = s->img_n;
    if (comp != (int *)0x0) {
      *comp = iVar20;
      sVar21 = s->img_y;
    }
    sVar25 = s->img_x;
    iVar28 = stbi__mad3sizes_valid(iVar20,sVar25,sVar21,0);
    if (iVar28 == 0) goto LAB_0018e2c6;
    puVar31 = (uchar *)stbi__malloc_mad3(iVar20,sVar25,sVar21,0);
    if (puVar31 != (uchar *)0x0) {
      stbi__getn(s,puVar31,sVar21 * iVar20 * sVar25);
      if (req_comp == 0) {
        return puVar31;
      }
      iVar20 = s->img_n;
      if (iVar20 != req_comp) {
        puVar31 = stbi__convert_format(puVar31,iVar20,req_comp,s->img_x,s->img_y);
        return puVar31;
      }
      return puVar31;
    }
    goto LAB_0018ceba;
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar20 = stbi__hdr_test(s);
  if (iVar20 != 0) {
    psVar29 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if (psVar29 == (stbi__jpeg *)0x0) {
      return (void *)0x0;
    }
    iVar20 = *x;
    iVar28 = *y;
    data_00 = (stbi__context *)stbi__malloc_mad3(iVar20,iVar28,req_comp,0);
    if (data_00 != (stbi__context *)0x0) {
      uVar58 = (req_comp + (req_comp & 1U)) - 1;
      uVar42 = iVar28 * iVar20;
      uVar37 = (ulong)uVar58;
      if ((int)uVar58 < 1) {
        uVar37 = 0;
      }
      lVar30 = (long)req_comp;
      uVar52 = (ulong)uVar42;
      if ((int)uVar42 < 1) {
        uVar52 = 0;
      }
      psVar44 = data_00;
      psVar50 = psVar29;
      for (uVar48 = 0; uVar48 != uVar52; uVar48 = uVar48 + 1) {
        for (uVar43 = 0; uVar37 != uVar43; uVar43 = uVar43 + 1) {
          dVar9 = pow((double)(*(float *)(psVar50->huff_dc[0].fast + uVar43 * 4 + -8) *
                              stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
          fVar65 = (float)dVar9 * 255.0 + 0.5;
          fVar64 = 0.0;
          if (0.0 <= fVar65) {
            fVar64 = fVar65;
          }
          fVar65 = 255.0;
          if (fVar64 <= 255.0) {
            fVar65 = fVar64;
          }
          psVar44->buffer_start[uVar43 - 0x38] = (stbi_uc)(int)fVar65;
        }
        if ((int)uVar37 < req_comp) {
          lVar47 = uVar48 * lVar30 + uVar37;
          fVar65 = *(float *)(psVar29->huff_dc[0].fast + lVar47 * 4 + -8) * 255.0 + 0.5;
          fVar64 = 0.0;
          if (0.0 <= fVar65) {
            fVar64 = fVar65;
          }
          fVar65 = 255.0;
          if (fVar64 <= 255.0) {
            fVar65 = fVar64;
          }
          data_00->buffer_start[lVar47 + -0x38] = (stbi_uc)(int)fVar65;
        }
        psVar44 = (stbi__context *)(psVar44->buffer_start + lVar30 + -0x38);
        psVar50 = (stbi__jpeg *)(psVar50->huff_dc[0].fast + lVar30 * 4 + -8);
      }
LAB_0018cc53:
      free(psVar29);
      return data_00;
    }
LAB_0018ceb5:
    free(psVar29);
LAB_0018ceba:
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  stbi__get8(s);
  bVar13 = stbi__get8(s);
  if (bVar13 < 2) {
    bVar14 = stbi__get8(s);
    if (bVar13 == 1) {
      if ((bVar14 & 0xf7) == 1) {
        iVar20 = 4;
        stbi__skip(s,4);
        bVar14 = stbi__get8(s);
        if ((bVar14 < 0x21) && ((0x101018100U >> ((ulong)bVar14 & 0x3f) & 1) != 0))
        goto LAB_0018d1d4;
      }
    }
    else if ((bVar14 & 0xf6) == 2) {
      iVar20 = 9;
LAB_0018d1d4:
      stbi__skip(s,iVar20);
      iVar20 = stbi__get16le(s);
      if ((iVar20 != 0) && (iVar20 = stbi__get16le(s), iVar20 != 0)) {
        bVar14 = stbi__get8(s);
        if (bVar13 == 1) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar14 - 8 & 0xf7) != 0) goto LAB_0018cd2f;
        }
        else {
          if ((0x20 < bVar14) || ((0x101018100U >> ((ulong)bVar14 & 0x3f) & 1) == 0))
          goto LAB_0018cd1f;
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        bVar14 = stbi__get8(s);
        sVar15 = stbi__get8(s);
        bVar17 = stbi__get8(s);
        iVar20 = stbi__get16le(s);
        uVar60 = stbi__get16le(s);
        bVar13 = stbi__get8(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar58 = stbi__get16le(s);
        uVar42 = stbi__get16le(s);
        bVar18 = stbi__get8(s);
        data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
        bVar19 = stbi__get8(s);
        coutput[0] = (stbi_uc *)((ulong)coutput[0]._4_4_ << 0x20);
        if (sVar15 == '\0') {
          uVar57 = bVar17 - 8;
          if (bVar17 < 8) {
            uVar57 = (uint)bVar17;
          }
          uVar57 = (uint)(uVar57 == 3);
          bVar13 = bVar18;
        }
        else {
          uVar57 = 0;
        }
        uVar57 = stbi__tga_get_comp((uint)bVar13,uVar57,(int *)data);
        if (uVar57 == 0) {
          stbi__g_failure_reason = "bad format";
          return (void *)0x0;
        }
        *x = uVar58;
        *y = uVar42;
        if (comp != (int *)0x0) {
          *comp = uVar57;
        }
        iVar28 = stbi__mad3sizes_valid(uVar58,uVar42,uVar57,0);
        if (iVar28 == 0) {
LAB_0018e2c6:
          stbi__g_failure_reason = "too large";
          return (void *)0x0;
        }
        psVar29 = (stbi__jpeg *)stbi__malloc_mad3(uVar58,uVar42,uVar57,0);
        if (psVar29 == (stbi__jpeg *)0x0) goto LAB_0018ceba;
        stbi__skip(s,(uint)bVar14);
        uVar37 = (ulong)uVar57;
        if (((sVar15 == '\0') && (bVar17 < 8)) && (data._0_4_ == 0)) {
          uVar59 = 0;
          uVar60 = uVar42;
          while (uVar60 = uVar60 - 1, uVar60 != 0xffffffff) {
            uVar54 = uVar59;
            if ((bVar19 >> 5 & 1) == 0) {
              uVar54 = uVar60;
            }
            stbi__getn(s,psVar29->huff_dc[0].fast + (long)(int)(uVar54 * uVar57 * uVar58) + -8,
                       uVar57 * uVar58);
            uVar59 = uVar59 + 1;
          }
        }
        else {
          if (sVar15 == '\0') {
            local_8958 = (stbi_uc *)0x0;
          }
          else {
            stbi__skip(s,iVar20);
            local_8958 = (stbi_uc *)stbi__malloc_mad2(uVar60,uVar57,0);
            if (local_8958 == (stbi_uc *)0x0) goto LAB_0018ceb5;
            if (data._0_4_ == 0) {
              iVar20 = stbi__getn(s,local_8958,uVar57 * uVar60);
              if (iVar20 == 0) {
                free(psVar29);
                free(local_8958);
                stbi__g_failure_reason = "bad palette";
                return (void *)0x0;
              }
            }
            else {
              if (uVar57 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_image.h"
                              ,0x15e6,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar30 = 0; uVar60 * 3 != (int)lVar30; lVar30 = lVar30 + 3) {
                stbi__tga_read_rgb16(s,local_8958 + lVar30);
              }
            }
          }
          bVar63 = true;
          iVar20 = 0;
          uVar59 = 0;
          psVar50 = psVar29;
          for (uVar52 = 0; uVar52 != uVar42 * uVar58; uVar52 = uVar52 + 1) {
            if (bVar17 < 8) {
LAB_0018e531:
              if (sVar15 == '\0') {
                if (data._0_4_ == 0) {
                  for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
                    sVar16 = stbi__get8(s);
                    *(stbi_uc *)((long)coutput + uVar48) = sVar16;
                  }
                }
                else {
                  if (uVar57 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_image.h"
                                  ,0x1617,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                }
              }
              else {
                if (bVar18 == 8) {
                  bVar13 = stbi__get8(s);
                  uVar54 = (uint)bVar13;
                }
                else {
                  uVar54 = stbi__get16le(s);
                }
                if (uVar60 <= uVar54) {
                  uVar54 = 0;
                }
                for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
                  *(stbi_uc *)((long)coutput + uVar48) = local_8958[uVar48 + uVar54 * uVar57];
                }
              }
            }
            else {
              if (iVar20 == 0) {
                bVar13 = stbi__get8(s);
                iVar20 = (bVar13 & 0x7f) + 1;
                uVar59 = (uint)(bVar13 >> 7);
                goto LAB_0018e531;
              }
              if (uVar59 == 0 || bVar63) {
                uVar59 = (uint)(uVar59 != 0);
                goto LAB_0018e531;
              }
              uVar59 = 1;
            }
            for (uVar48 = 0; uVar37 != uVar48; uVar48 = uVar48 + 1) {
              psVar50->huff_dc[0].fast[uVar48 - 8] = *(stbi_uc *)((long)coutput + uVar48);
            }
            iVar20 = iVar20 + -1;
            psVar50 = (stbi__jpeg *)(psVar50->huff_dc[0].fast + (uVar37 - 8));
            bVar63 = false;
          }
          if ((bVar19 >> 5 & 1) == 0) {
            iVar20 = uVar57 * uVar58;
            iVar28 = (uVar42 - 1) * iVar20;
            uVar60 = 0;
            for (uVar59 = 0; uVar59 != uVar42 + 1 >> 1; uVar59 = uVar59 + 1) {
              psVar50 = psVar29;
              for (iVar51 = iVar20; 0 < iVar51; iVar51 = iVar51 + -1) {
                sVar15 = psVar50->huff_dc[0].fast[(ulong)uVar60 - 8];
                psVar50->huff_dc[0].fast[(ulong)uVar60 - 8] =
                     psVar50->huff_dc[0].fast[(long)iVar28 + -8];
                psVar50->huff_dc[0].fast[(long)iVar28 + -8] = sVar15;
                psVar50 = (stbi__jpeg *)((long)&psVar50->s + 1);
              }
              uVar60 = uVar60 + iVar20;
              iVar28 = iVar28 - iVar20;
            }
          }
          free(local_8958);
        }
        if ((2 < uVar57) && (data._0_4_ == 0)) {
          iVar20 = uVar42 * uVar58;
          puVar39 = (undefined1 *)((long)&psVar29->s + 2);
          while (bVar63 = iVar20 != 0, iVar20 = iVar20 + -1, bVar63) {
            uVar5 = puVar39[-2];
            puVar39[-2] = *puVar39;
            *puVar39 = uVar5;
            puVar39 = puVar39 + uVar37;
          }
        }
        if (req_comp == 0) {
          return psVar29;
        }
        if (uVar57 == req_comp) {
          return psVar29;
        }
LAB_0018dfd6:
        puVar31 = stbi__convert_format((uchar *)psVar29,uVar57,req_comp,uVar58,uVar42);
        return puVar31;
      }
    }
  }
LAB_0018cd1f:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_0018cd2f:
  stbi__g_failure_reason = "unknown image type";
  return (void *)0x0;
LAB_0018c5aa:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0018cc44;
LAB_0018b527:
  bVar13 = stbi__get_marker(psVar29);
  goto LAB_0018b4c4;
LAB_0018df6e:
  stbi__g_failure_reason = "bad file";
LAB_0018df8f:
  free(psVar29);
  psVar29 = (stbi__jpeg *)0x0;
LAB_0018df96:
  *x = uVar58;
  *y = uVar42;
  bVar63 = req_comp != 0;
  if (bVar63) {
    iVar20 = req_comp;
  }
  req_comp = iVar20;
  if (!bVar63 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar57 = 4;
  goto LAB_0018dfd6;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}